

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::Mesh::reduce_array<signed_char>
          (Mesh *this,Int ent_dim,Read<signed_char> *a,Int width,Omega_h_Op op)

{
  int *piVar1;
  long *plVar2;
  Alloc *pAVar3;
  bool bVar4;
  undefined4 in_register_0000000c;
  ulong *puVar5;
  undefined8 extraout_RDX;
  void *pvVar6;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  Read<signed_char> RVar7;
  Alloc *local_d0;
  ulong local_c8;
  Dist local_c0;
  
  puVar5 = (ulong *)CONCAT44(in_register_0000000c,width);
  bVar4 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (bVar4) {
    ask_dist(&local_c0,(Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    local_d0 = (Alloc *)*puVar5;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0 = (Alloc *)(local_d0->size * 8 + 1);
      }
      else {
        local_d0->use_count = local_d0->use_count + 1;
      }
    }
    local_c8 = puVar5[1];
    Dist::exch_reduce<signed_char>((Dist *)this,(Read<signed_char> *)&local_c0,(Int)&local_d0,op);
    pAVar3 = local_d0;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      piVar1 = &local_d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0);
        operator_delete(pAVar3,0x48);
      }
    }
    Dist::~Dist(&local_c0);
    pvVar6 = extraout_RDX_00;
  }
  else {
    plVar2 = (long *)*puVar5;
    *(long **)this = plVar2;
    (this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)puVar5[1];
    bVar4 = ((ulong)plVar2 & 7) != 0;
    pvVar6 = (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar4 || plVar2 == (long *)0x0);
    if ((!bVar4 && plVar2 != (long *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(plVar2 + 6) = (int)plVar2[6] + -1;
      *(long *)this = *plVar2 * 8 + 1;
    }
    *puVar5 = 0;
    puVar5[1] = 0;
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar7.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::reduce_array(Int ent_dim, Read<T> a, Int width, Omega_h_Op op) {
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).exch_reduce(a, width, op);
}